

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::getVertex(embree *this,GridMesh *gmesh,RTCGeometry subdiv,Grid *hgrids,int firstHalfEdge,
                 int f,int i,int x,int y,Vec3fa *opt)

{
  Vec3fa *pVVar1;
  int iVar2;
  int iVar3;
  Grid *grid;
  float fVar4;
  float fVar6;
  float fVar7;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar8;
  float fVar5;
  
  if (x < 0) {
    iVar3 = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    iVar2 = rtcGetGeometryOppositeHalfEdge(subdiv,0,iVar3);
    if (iVar2 == iVar3) {
LAB_0011cd36:
      fVar4 = (opt->field_0).m128[0];
      fVar5 = (opt->field_0).m128[1];
      fVar6 = (opt->field_0).m128[2];
      fVar7 = (opt->field_0).m128[3];
    }
    else {
      pVVar1 = gmesh->vertices +
               (int)(y * hgrids[iVar2].strideX + hgrids[iVar2].startVertexID + hgrids[iVar2].strideY
                    );
      fVar4 = (pVVar1->field_0).m128[0];
      fVar5 = (pVVar1->field_0).m128[1];
      fVar6 = (pVVar1->field_0).m128[2];
      fVar7 = (pVVar1->field_0).m128[3];
    }
  }
  else {
    if (-1 < y) {
      if (x < (int)hgrids[firstHalfEdge].width) {
        if (y < (int)hgrids[firstHalfEdge].height) {
          grid = hgrids + firstHalfEdge;
          iVar3 = x;
          x = y;
        }
        else {
          iVar3 = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
          grid = hgrids + iVar3;
          iVar3 = hgrids[iVar3].height - 2;
        }
      }
      else {
        iVar3 = rtcGetGeometryNextHalfEdge(subdiv,firstHalfEdge);
        grid = hgrids + iVar3;
        x = hgrids[iVar3].height - 2;
        iVar3 = y;
      }
      VVar8 = getVertex(this,gmesh,grid,iVar3,x);
      in_XMM1_Qa = VVar8.field_0._8_8_;
      fVar4 = VVar8.field_0._0_4_;
      fVar5 = VVar8.field_0._4_4_;
      goto LAB_0011cdd0;
    }
    iVar3 = rtcGetGeometryOppositeHalfEdge(subdiv,0,firstHalfEdge);
    if (iVar3 == firstHalfEdge) goto LAB_0011cd36;
    iVar3 = rtcGetGeometryNextHalfEdge(subdiv,iVar3);
    pVVar1 = gmesh->vertices +
             (int)(hgrids[iVar3].strideX + hgrids[iVar3].startVertexID + x * hgrids[iVar3].strideY);
    fVar4 = (pVVar1->field_0).m128[0];
    fVar5 = (pVVar1->field_0).m128[1];
    fVar6 = (pVVar1->field_0).m128[2];
    fVar7 = (pVVar1->field_0).m128[3];
  }
  *(float *)this = fVar4;
  *(float *)(this + 4) = fVar5;
  *(float *)(this + 8) = fVar6;
  *(float *)(this + 0xc) = fVar7;
LAB_0011cdd0:
  VVar8.field_0.m128[1] = fVar5;
  VVar8.field_0.m128[0] = fVar4;
  VVar8.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar8.field_0;
}

Assistant:

Vec3fa getVertex(GridMesh& gmesh, RTCGeometry subdiv, Grid *hgrids, int firstHalfEdge, int f, int i, int x, int y, const Vec3fa& opt)
{
  int width  = (int)hgrids[firstHalfEdge].width;
  int height = (int)hgrids[firstHalfEdge].height;
  if (x < 0) {
    assert(x == -1 && y >= 0 && y < height);
    int edge = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    int oedge = rtcGetGeometryOppositeHalfEdge(subdiv,0,edge);
    if (oedge == edge) return opt; // return alternative vertex when requested vertex does not exist
    return getVertex(gmesh,hgrids[oedge],y,1);
  }
  else if (y < 0) {
    assert(y == -1 && x >= 0 && x < width);
    int oedge = rtcGetGeometryOppositeHalfEdge(subdiv,0,firstHalfEdge);
    if (oedge == firstHalfEdge) return opt; // return alternative vertex when requested vertex does not exist
    int noedge = rtcGetGeometryNextHalfEdge(subdiv,oedge);
    return getVertex(gmesh,hgrids[noedge],1,x);
  }
  else if (x >= width) {
    assert(x == width && y >= 0 && y < height);
    int nedge = rtcGetGeometryNextHalfEdge(subdiv,firstHalfEdge);
    return getVertex(gmesh,hgrids[nedge],y,hgrids[nedge].height-2);
  }
  else if (y >= height) {
    assert(y == height && x >= 0 && x < width);
    int pedge = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    return getVertex(gmesh,hgrids[pedge],hgrids[pedge].height-2,x);
  }
  else {
    return getVertex(gmesh,hgrids[firstHalfEdge],x,y);
  }
}